

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  initializer_list<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  int iVar1;
  A<BaseVirtual> *this_00;
  B<BaseVirtual> *this_01;
  C<BaseVirtual> *this_02;
  mapped_type *pmVar2;
  ostream *poVar3;
  element_type *this_03;
  element_type *this_04;
  element_type *this_05;
  element_type *peVar4;
  undefined4 extraout_var;
  element_type *peVar5;
  undefined4 extraout_var_00;
  element_type *peVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3c0;
  key_type local_330;
  key_type local_328;
  key_type local_320;
  key_type local_318;
  key_type local_310;
  key_type local_308;
  key_type local_300;
  key_type local_2f8;
  key_type local_2f0;
  key_type local_2e8;
  key_type local_2e0;
  key_type local_2d8;
  key_type local_2d0;
  key_type local_2c8;
  key_type local_2c0;
  key_type local_2b8;
  key_type local_2b0;
  key_type local_2a8;
  C<BaseVirtual> *local_2a0;
  C<BaseVirtual> *cvp;
  B<BaseVirtual> *bvp;
  A<BaseVirtual> *avp;
  C<Base> *cp;
  B<Base> *bp;
  A<Base> *ap;
  shared_ptr<C<BaseVirtual>_> cvsp;
  shared_ptr<B<BaseVirtual>_> bvsp;
  shared_ptr<A<BaseVirtual>_> avsp;
  shared_ptr<C<Base>_> csp;
  shared_ptr<B<Base>_> bsp;
  shared_ptr<A<Base>_> asp;
  C<BaseVirtual> cv;
  B<BaseVirtual> bv;
  A<BaseVirtual> av;
  C<Base> c;
  B<Base> b;
  A<Base> a;
  type_index local_1e8;
  type_index local_1e0;
  type_index local_1d8;
  type_index local_1d0;
  type_index local_1c8;
  type_index local_1c0 [3];
  type_index local_1a8;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1a0;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_58 [24];
  map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  typeToStringMap;
  char **argv_local;
  int argc_local;
  
  local_1a0 = &local_198;
  typeToStringMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  std::type_index::type_index(&local_1a8,(type_info *)&Base::typeinfo);
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[5],_true>(&local_198,&local_1a8,(char (*) [5])0x11800b);
  local_1a0 = &local_170;
  std::type_index::type_index(local_1c0,(type_info *)&A<Base>::typeinfo);
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[6],_true>(&local_170,local_1c0,(char (*) [6])"ABase");
  local_1a0 = &local_148;
  std::type_index::type_index(&local_1c8,(type_info *)&B<Base>::typeinfo);
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[6],_true>(&local_148,&local_1c8,(char (*) [6])"BBase");
  local_1a0 = &local_120;
  std::type_index::type_index(&local_1d0,(type_info *)&C<Base>::typeinfo);
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[6],_true>(&local_120,&local_1d0,(char (*) [6])"CBase");
  local_1a0 = &local_f8;
  std::type_index::type_index(&local_1d8,(type_info *)&BaseVirtual::typeinfo);
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[12],_true>(&local_f8,&local_1d8,(char (*) [12])0x11801d);
  local_1a0 = &local_d0;
  std::type_index::type_index(&local_1e0,(type_info *)&A<BaseVirtual>::typeinfo);
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[13],_true>
            (&local_d0,&local_1e0,(char (*) [13])"ABaseVirtual");
  local_1a0 = &local_a8;
  std::type_index::type_index(&local_1e8,(type_info *)&B<BaseVirtual>::typeinfo);
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[13],_true>
            (&local_a8,&local_1e8,(char (*) [13])"BBaseVirtual");
  local_1a0 = &local_80;
  std::type_index::type_index
            ((type_index *)&stack0xfffffffffffffe10,(type_info *)&C<BaseVirtual>::typeinfo);
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[13],_true>
            (&local_80,(type_index *)&stack0xfffffffffffffe10,(char (*) [13])"CBaseVirtual");
  local_58._0_8_ = &local_198;
  local_58._8_8_ = 8;
  this = (allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&av.super_BaseVirtual._vptr_BaseVirtual + 6);
  std::
  allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(this);
  __l._M_len = local_58._8_8_;
  __l._M_array = (iterator)local_58._0_8_;
  std::
  map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)(local_58 + 0x10),__l,
        (less<std::type_index> *)((long)&av.super_BaseVirtual._vptr_BaseVirtual + 7),this);
  std::
  allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&av.super_BaseVirtual._vptr_BaseVirtual + 6));
  local_3c0 = (pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_58;
  do {
    local_3c0 = local_3c0 + -1;
    std::
    pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_3c0);
  } while (local_3c0 != &local_198);
  A<BaseVirtual>::A((A<BaseVirtual> *)&bv);
  B<BaseVirtual>::B((B<BaseVirtual> *)&cv);
  C<BaseVirtual>::C((C<BaseVirtual> *)
                    &asp.super___shared_ptr<A<Base>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<A<Base>>();
  std::make_shared<B<Base>>();
  std::make_shared<C<Base>>();
  std::make_shared<A<BaseVirtual>>();
  std::make_shared<B<BaseVirtual>>();
  std::make_shared<C<BaseVirtual>>();
  bp = (B<Base> *)operator_new(1);
  cp = (C<Base> *)operator_new(1);
  avp = (A<BaseVirtual> *)operator_new(1);
  this_00 = (A<BaseVirtual> *)operator_new(8);
  A<BaseVirtual>::A(this_00);
  bvp = (B<BaseVirtual> *)this_00;
  this_01 = (B<BaseVirtual> *)operator_new(8);
  B<BaseVirtual>::B(this_01);
  cvp = (C<BaseVirtual> *)this_01;
  this_02 = (C<BaseVirtual> *)operator_new(8);
  C<BaseVirtual>::C(this_02);
  local_2a0 = this_02;
  local_2a8._M_target =
       (type_info *)
       Base::get_type_index((Base *)((long)&av.super_BaseVirtual._vptr_BaseVirtual + 5));
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2a8);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_2b0._M_target =
       (type_info *)
       Base::get_type_index((Base *)((long)&av.super_BaseVirtual._vptr_BaseVirtual + 4));
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2b0);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_2b8._M_target =
       (type_info *)
       Base::get_type_index((Base *)((long)&av.super_BaseVirtual._vptr_BaseVirtual + 3));
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2b8);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_2c0._M_target = (type_info *)BaseVirtual::get_type_index(&bv.super_BaseVirtual);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2c0);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_2c8._M_target = (type_info *)BaseVirtual::get_type_index(&cv.super_BaseVirtual);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2c8);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_2d0._M_target =
       (type_info *)
       BaseVirtual::get_type_index
                 ((BaseVirtual *)
                  &asp.super___shared_ptr<A<Base>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2d0);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this_03 = std::__shared_ptr_access<A<Base>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<A<Base>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &bsp.super___shared_ptr<B<Base>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_2d8._M_target = (type_info *)Base::get_type_index((Base *)this_03);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2d8);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this_04 = std::__shared_ptr_access<B<Base>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<B<Base>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &csp.super___shared_ptr<C<Base>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_2e0._M_target = (type_info *)Base::get_type_index((Base *)this_04);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2e0);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this_05 = std::__shared_ptr_access<C<Base>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<C<Base>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &avsp.super___shared_ptr<A<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
  local_2e8._M_target = (type_info *)Base::get_type_index((Base *)this_05);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2e8);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  peVar4 = std::__shared_ptr_access<A<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<A<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&bvsp.super___shared_ptr<B<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  iVar1 = (**(peVar4->super_BaseVirtual)._vptr_BaseVirtual)();
  local_2f0._M_target = (type_info *)CONCAT44(extraout_var,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2f0);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  peVar5 = std::__shared_ptr_access<B<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<B<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&cvsp.super___shared_ptr<C<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  iVar1 = (**(peVar5->super_BaseVirtual)._vptr_BaseVirtual)();
  local_2f8._M_target = (type_info *)CONCAT44(extraout_var_00,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_2f8);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  peVar6 = std::__shared_ptr_access<C<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<C<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&ap);
  iVar1 = (**(peVar6->super_BaseVirtual)._vptr_BaseVirtual)();
  local_300._M_target = (type_info *)CONCAT44(extraout_var_01,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_300);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_308._M_target = (type_info *)Base::get_type_index((Base *)bp);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_308);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_310._M_target = (type_info *)Base::get_type_index((Base *)cp);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_310);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_318._M_target = (type_info *)Base::get_type_index((Base *)avp);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_318);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar1 = (**(bvp->super_BaseVirtual)._vptr_BaseVirtual)();
  local_320._M_target = (type_info *)CONCAT44(extraout_var_02,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_320);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar1 = (**(cvp->super_BaseVirtual)._vptr_BaseVirtual)();
  local_328._M_target = (type_info *)CONCAT44(extraout_var_03,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_328);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar1 = (**(local_2a0->super_BaseVirtual)._vptr_BaseVirtual)();
  local_330._M_target = (type_info *)CONCAT44(extraout_var_04,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_58 + 0x10),&local_330);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<C<BaseVirtual>_>::~shared_ptr((shared_ptr<C<BaseVirtual>_> *)&ap);
  std::shared_ptr<B<BaseVirtual>_>::~shared_ptr
            ((shared_ptr<B<BaseVirtual>_> *)
             &cvsp.super___shared_ptr<C<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<A<BaseVirtual>_>::~shared_ptr
            ((shared_ptr<A<BaseVirtual>_> *)
             &bvsp.super___shared_ptr<B<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<C<Base>_>::~shared_ptr
            ((shared_ptr<C<Base>_> *)
             &avsp.super___shared_ptr<A<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<B<Base>_>::~shared_ptr
            ((shared_ptr<B<Base>_> *)
             &csp.super___shared_ptr<C<Base>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<A<Base>_>::~shared_ptr
            ((shared_ptr<A<Base>_> *)
             &bsp.super___shared_ptr<B<Base>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(local_58 + 0x10));
  return 0;
}

Assistant:

int main( int argc,
          char **argv )
{
  std::map<std::type_index, std::string> typeToStringMap = { { std::type_index( typeid(Base) ), "Base" }, { std::type_index( typeid(A<Base> ) ), "ABase" }, { std::type_index( typeid(B<Base> ) ), "BBase" }, { std::type_index( typeid(C<Base> ) ), "CBase" }, { std::type_index( typeid(BaseVirtual) ),
      "BaseVirtual" }, { std::type_index( typeid(A<BaseVirtual> ) ), "ABaseVirtual" }, { std::type_index( typeid(B<BaseVirtual> ) ), "BBaseVirtual" }, { std::type_index( typeid(C<BaseVirtual> ) ), "CBaseVirtual" } };

  A<Base> a;
  B<Base> b;
  C<Base> c;

  A<BaseVirtual> av;
  B<BaseVirtual> bv;
  C<BaseVirtual> cv;

  auto asp = std::make_shared<A<Base>>( );
  auto bsp = std::make_shared<B<Base>>( );
  auto csp = std::make_shared<C<Base>>( );

  auto avsp = std::make_shared<A<BaseVirtual>>( );
  auto bvsp = std::make_shared<B<BaseVirtual>>( );
  auto cvsp = std::make_shared<C<BaseVirtual>>( );

  A<Base>* ap = new A<Base>;
  B<Base>* bp = new B<Base>;
  C<Base>* cp = new C<Base>;

  A<BaseVirtual>* avp = new A<BaseVirtual>;
  B<BaseVirtual>* bvp = new B<BaseVirtual>;
  C<BaseVirtual>* cvp = new C<BaseVirtual>;

  std::cout << typeToStringMap[a.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[b.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[c.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[av.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bv.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cv.get_type_index( )] << std::endl;

  std::cout << typeToStringMap[asp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bsp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[csp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[avsp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bvsp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cvsp->get_type_index( )] << std::endl;

  std::cout << typeToStringMap[ap->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[avp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bvp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cvp->get_type_index( )] << std::endl;
}